

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O0

void __thiscall
Shell::Options::OptionValue<bool>::OptionValue(OptionValue<bool> *this,string *l,string *s,bool def)

{
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  *in_stack_ffffffffffffff90;
  string local_60 [16];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  AbstractOptionValue *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
  std::__cxx11::string::string(local_60,in_RDX);
  AbstractOptionValue::AbstractOptionValue
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  *in_RDI = &PTR__OptionValue_013023b8;
  *(byte *)((long)in_RDI + 0x91) = in_CL & 1;
  *(byte *)((long)in_RDI + 0x92) = in_CL & 1;
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
  ::Stack((Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
           *)in_stack_ffffffffffffff90,(size_t)in_RDX);
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  ::Stack(in_stack_ffffffffffffff90,(size_t)in_RDX);
  return;
}

Assistant:

OptionValue(std::string l, std::string s,T def) : AbstractOptionValue(l,s),
        defaultValue(def), actualValue(def){}